

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_pollset_check(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,_Bool *pwant_read,
                       _Bool *pwant_write)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (ps->num == uVar2) {
      *pwant_write = false;
      *pwant_read = false;
      return;
    }
    uVar1 = uVar2 + 1;
  } while (ps->sockets[uVar2] != sock);
  *pwant_read = (_Bool)(ps->actions[uVar2] & 1);
  *pwant_write = (_Bool)(ps->actions[uVar2] >> 1 & 1);
  return;
}

Assistant:

void Curl_pollset_check(struct Curl_easy *data,
                        struct easy_pollset *ps, curl_socket_t sock,
                        bool *pwant_read, bool *pwant_write)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      *pwant_read = !!(ps->actions[i] & CURL_POLL_IN);
      *pwant_write = !!(ps->actions[i] & CURL_POLL_OUT);
      return;
    }
  }
  *pwant_read = *pwant_write = FALSE;
}